

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall QString::append(QString *this,QLatin1StringView str)

{
  char16_t *pcVar1;
  difference_type __d;
  char *str_00;
  size_t size;
  qsizetype len;
  
  str_00 = str.m_data;
  size = str.m_size;
  if ((long)size < 1 || str_00 == (char *)0x0) {
    if ((str_00 != (char *)0x0) && ((this->d).ptr == (char16_t *)0x0)) {
      operator=(this,(QLatin1StringView)(ZEXT816(0x4e3fd9) << 0x40));
    }
  }
  else {
    QArrayDataPointer<char16_t>::detachAndGrow
              (&this->d,GrowsAtEnd,size,(char16_t **)0x0,(QArrayDataPointer<char16_t> *)0x0);
    pcVar1 = (this->d).ptr;
    if (pcVar1 == (char16_t *)0x0) {
      qBadAlloc();
    }
    pcVar1 = pcVar1 + (this->d).size;
    qt_from_latin1(pcVar1,str_00,size);
    resize(this,(long)((long)pcVar1 + (size * 2 - (long)(this->d).ptr)) >> 1);
  }
  return this;
}

Assistant:

QString &QString::append(QLatin1StringView str)
{
    append_helper(*this, str);
    return *this;
}